

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O3

void __thiscall efsw::FileWatcherGeneric::removeWatch(FileWatcherGeneric *this,WatchID watchid)

{
  size_t *psVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (_List_node_base *)&this->mWatches;
  do {
    p_Var3 = (((_List_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->mWatches) {
      return;
    }
    plVar2 = (long *)p_Var3[1]._M_next;
  } while (plVar2[1] != watchid);
  Mutex::lock(&this->mWatchesLock);
  psVar1 = &(this->mWatches).
            super__List_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var3,0x18);
  (**(code **)(*plVar2 + 8))(plVar2);
  Mutex::unlock(&this->mWatchesLock);
  return;
}

Assistant:

void FileWatcherGeneric::removeWatch(WatchID watchid)
{
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); it++ )
	{
		if ( (*it)->ID == watchid )
		{
			WatcherGeneric * watch = (*it);

			mWatchesLock.lock();

			mWatches.erase( it );

			efSAFE_DELETE( watch ) ;

			mWatchesLock.unlock();

			return;
		}
	}
}